

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void VELOCYPACK_XXH128_canonicalFromHash(XXH128_canonical_t *dst,XXH128_hash_t hash)

{
  xxh_u64 xVar1;
  xxh_u64 xVar2;
  xxh_u64 in_RDX;
  xxh_u64 in_RSI;
  xxh_u64 *in_RDI;
  
  xVar1 = XXH_swap64(in_RDX);
  xVar2 = XXH_swap64(in_RSI);
  *in_RDI = xVar1;
  in_RDI[1] = xVar2;
  return;
}

Assistant:

XXH_PUBLIC_API void XXH128_canonicalFromHash(XXH128_canonical_t* dst,
                                             XXH128_hash_t hash) {
  XXH_STATIC_ASSERT(sizeof(XXH128_canonical_t) == sizeof(XXH128_hash_t));
  if (XXH_CPU_LITTLE_ENDIAN) {
    hash.high64 = XXH_swap64(hash.high64);
    hash.low64 = XXH_swap64(hash.low64);
  }
  memcpy(dst, &hash.high64, sizeof(hash.high64));
  memcpy((char*)dst + sizeof(hash.high64), &hash.low64, sizeof(hash.low64));
}